

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::replace(CBString *this,int pos,int len,char *s,uchar cfill)

{
  uint uVar1;
  size_t sVar2;
  CBStringException *pCVar3;
  long lVar4;
  uchar *puVar5;
  ulong uVar6;
  undefined7 in_register_00000081;
  int iVar7;
  ulong uVar8;
  allocator local_fd;
  int local_fc;
  CBStringException bstr__cppwrapper_exception;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  tagbstring t;
  
  if ((this->super_tagbstring).mlen < 1) {
    std::__cxx11::string::string((string *)&local_60,"CBString::Write protection error",&local_fd);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if ((s == (char *)0x0) || ((len | pos) < 0)) {
    std::__cxx11::string::string((string *)&local_80,"CBString::Failure in replace",&local_fd);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  local_fc = len + pos;
  uVar1 = (this->super_tagbstring).slen;
  if (local_fc < (int)uVar1) {
    puVar5 = (this->super_tagbstring).data;
    if ((uint)((int)puVar5 - (int)s) < uVar1) {
      local_fc = (int)CONCAT71(in_register_00000081,cfill);
      CBString((CBString *)&bstr__cppwrapper_exception,s);
      replace(this,pos,len,(CBString *)&bstr__cppwrapper_exception,(uchar)local_fc);
      ~CBString((CBString *)&bstr__cppwrapper_exception);
    }
    else {
      sVar2 = strlen(s);
      uVar6 = (ulong)len;
      if (len < 0 || uVar6 < sVar2) {
        uVar8 = ((long)(int)uVar1 - uVar6) + sVar2;
        if (0x7ffffffe < uVar8) {
          std::__cxx11::string::string
                    ((string *)&local_c0,"CBString::Failure in replace, result too long.",&local_fd)
          ;
          CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
          CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
          __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
        }
        alloc(this,(int)uVar8);
        puVar5 = (this->super_tagbstring).data;
        if (puVar5 == (uchar *)0x0) {
          return;
        }
      }
      iVar7 = (int)sVar2 - len;
      if (iVar7 != 0) {
        memmove(puVar5 + sVar2 + (long)pos,puVar5 + uVar6 + (long)pos,
                (long)(this->super_tagbstring).slen - (long)local_fc);
        puVar5 = (this->super_tagbstring).data;
      }
      memcpy(puVar5 + pos,s,sVar2);
      lVar4 = (long)iVar7 + (long)(this->super_tagbstring).slen;
      (this->super_tagbstring).slen = (int)lVar4;
      (this->super_tagbstring).data[lVar4] = '\0';
    }
  }
  else {
    t.data = (uchar *)s;
    sVar2 = strlen(s);
    t.slen = (int)sVar2;
    t.mlen = -1;
    iVar7 = bsetstr(&this->super_tagbstring,pos,&t,cfill);
    if (iVar7 == -1) {
      std::__cxx11::string::string((string *)&local_a0,"CBString::Failure in replace",&local_fd);
      CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar3,&bstr__cppwrapper_exception);
      __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    iVar7 = (int)((long)pos + (long)t.slen);
    if (iVar7 < (this->super_tagbstring).slen) {
      (this->super_tagbstring).slen = iVar7;
      (this->super_tagbstring).data[(long)pos + (long)t.slen] = '\0';
    }
  }
  return;
}

Assistant:

void CBString::replace (int pos, int len, const char * s, unsigned char cfill) {
struct tagbstring t;
size_t q;

	if (mlen <= 0) bstringThrow ("Write protection error");
	if (NULL == s || (pos|len) < 0) {
		bstringThrow ("Failure in replace");
	} else {
		if (pos + len >= slen) {
			cstr2tbstr (t, s);
			if (BSTR_ERR == bsetstr (this, pos, &t, cfill)) {
				bstringThrow ("Failure in replace");
			} else if (pos + t.slen < slen) {
				slen = pos + t.slen;
				data[slen] = '\0';
			}
		} else {

			/* Aliasing case */
			if ((unsigned int) (data - (unsigned char *) s) < (unsigned int) slen) {
				replace (pos, len, CBString(s), cfill);
				return;
			}

			if ((q = strlen (s)) > (size_t) len || len < 0) {
				if (slen + q - len >= INT_MAX) bstringThrow ("Failure in replace, result too long.");
				alloc ((int) (slen + q - len));
				if (NULL == data) return;
			}
			if ((int) q != len) bstr__memmove (data + pos + q, data + pos + len, slen - (pos + len));
			bstr__memcpy (data + pos, s, q);
			slen += ((int) q) - len;
			data[slen] = '\0';
		}
	}
}